

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper-a64.c
# Opt level: O3

float64 helper_frecpx_f64_aarch64(float64 a,void *fpstp)

{
  int iVar1;
  float64 fVar2;
  ulong uVar3;
  
  if ((a & 0x7fffffffffffffff) < 0x7ff0000000000001) {
    fVar2 = float64_squash_input_denormal_aarch64(a,(float_status *)fpstp);
    uVar3 = fVar2 >> 0x34 & 0x7ff;
    if (uVar3 == 0) {
      a = fVar2 & 0x8000000000000000 | 0x7fe0000000000000;
    }
    else {
      a = (uVar3 << 0x34 | fVar2 & 0x8000000000000000) ^ 0x7ff0000000000000;
    }
  }
  else {
    iVar1 = float64_is_signaling_nan_aarch64(a,(float_status *)fpstp);
    if (iVar1 != 0) {
      float_raise_aarch64('\x01',(float_status *)fpstp);
      a = float64_silence_nan_aarch64(a,(float_status *)fpstp);
    }
    if (*(char *)((long)fpstp + 6) != '\0') {
      fVar2 = float64_default_nan_aarch64((float_status *)fpstp);
      return fVar2;
    }
  }
  return a;
}

Assistant:

float64 HELPER(frecpx_f64)(float64 a, void *fpstp)
{
    float_status *fpst = fpstp;
    uint64_t val64, sbit;
    int64_t exp;

    if (float64_is_any_nan(a)) {
        float64 nan = a;
        if (float64_is_signaling_nan(a, fpst)) {
            float_raise(float_flag_invalid, fpst);
            nan = float64_silence_nan(a, fpst);
        }
        if (fpst->default_nan_mode) {
            nan = float64_default_nan(fpst);
        }
        return nan;
    }

    a = float64_squash_input_denormal(a, fpst);

    val64 = float64_val(a);
    sbit = 0x8000000000000000ULL & val64;
    exp = extract64(float64_val(a), 52, 11);

    if (exp == 0) {
        return make_float64(sbit | (0x7feULL << 52));
    } else {
        return make_float64(sbit | (~exp & 0x7ffULL) << 52);
    }
}